

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O0

bool __thiscall crnlib::buffer_stream::seek(buffer_stream *this,int64 ofs,bool relative)

{
  bool bVar1;
  long local_40;
  int64 new_ofs;
  bool relative_local;
  int64 ofs_local;
  buffer_stream *this_local;
  
  if ((((this->super_data_stream).field_0x1a & 1) == 0) ||
     (bVar1 = data_stream::is_seekable(&this->super_data_stream), !bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    local_40 = ofs;
    if (relative) {
      local_40 = (ulong)this->m_ofs + ofs;
    }
    if (local_40 < 0) {
      this_local._7_1_ = false;
    }
    else if ((long)(ulong)this->m_size < local_40) {
      this_local._7_1_ = false;
    }
    else {
      this->m_ofs = (uint)local_40;
      data_stream::post_seek(&this->super_data_stream);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

virtual bool seek(int64 ofs, bool relative)
        {
            if ((!m_opened) || (!is_seekable()))
            {
                return false;
            }

            int64 new_ofs = relative ? (m_ofs + ofs) : ofs;

            if (new_ofs < 0)
            {
                return false;
            }
            else if (new_ofs > m_size)
            {
                return false;
            }

            m_ofs = static_cast<uint>(new_ofs);

            post_seek();

            return true;
        }